

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_k_means_test.cc
# Opt level: O0

void __thiscall AV1Kmeans::AV1KmeansTest2::SetUp(AV1KmeansTest2 *this)

{
  byte bVar1;
  ACMRandom *in_RDI;
  int i_1;
  int i;
  int in_stack_ffffffffffffffdc;
  int local_10;
  int local_c;
  
  libaom_test::ACMRandom::DeterministicSeed();
  libaom_test::ACMRandom::Reset(in_RDI,in_stack_ffffffffffffffdc);
  for (local_c = 0; local_c < 0x2000; local_c = local_c + 1) {
    bVar1 = libaom_test::ACMRandom::Rand8(in_RDI);
    *(ushort *)((long)&in_RDI[7].random_.state_ + (long)local_c * 2) = (ushort)bVar1;
  }
  for (local_10 = 0; local_10 < 0x10; local_10 = local_10 + 1) {
    bVar1 = libaom_test::ACMRandom::Rand8(in_RDI);
    *(ushort *)((long)&in_RDI[0x1007].random_.state_ + (long)local_10 * 2) = (ushort)bVar1;
  }
  return;
}

Assistant:

void AV1KmeansTest2::SetUp() {
  rnd_.Reset(libaom_test::ACMRandom::DeterministicSeed());
  for (int i = 0; i < 4096 * 2; ++i) {
    data_[i] = (int)rnd_.Rand8();
  }
  for (int i = 0; i < 8 * 2; i++) {
    centroids_[i] = (int)rnd_.Rand8();
  }
}